

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O0

void csc709Inverse64(float *comp0,float *comp1,float *comp2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  __m128 c0;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float local_f08;
  float fStack_f04;
  float fStack_f00;
  float fStack_efc;
  float local_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float local_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float local_e08;
  float fStack_e04;
  float fStack_e00;
  float fStack_dfc;
  float local_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float local_d98;
  float fStack_d94;
  float fStack_d90;
  float fStack_d8c;
  float local_d88;
  float fStack_d84;
  float fStack_d80;
  float fStack_d7c;
  float local_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float local_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  float local_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  __m128 src [3];
  float fStack_50;
  float fStack_4c;
  __m128 *b;
  __m128 *g;
  __m128 *r;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  
  uVar1 = *(undefined8 *)in_RDI;
  uVar2 = *(undefined8 *)(in_RDI + 2);
  uVar3 = *(undefined8 *)in_RSI;
  uVar4 = *(undefined8 *)(in_RSI + 2);
  local_818 = (float)*(undefined8 *)in_RDX;
  fStack_814 = (float)((ulong)*(undefined8 *)in_RDX >> 0x20);
  fStack_810 = (float)*(undefined8 *)(in_RDX + 2);
  fStack_80c = (float)((ulong)*(undefined8 *)(in_RDX + 2) >> 0x20);
  c2[2] = (float)*(undefined8 *)in_RDI;
  c2[3] = (float)((ulong)*(undefined8 *)in_RDI >> 0x20);
  c1[0] = (float)*(undefined8 *)(in_RDI + 2);
  c1[1] = (float)((ulong)*(undefined8 *)(in_RDI + 2) >> 0x20);
  *in_RDI = c2[2] + local_818 * 1.5747;
  in_RDI[1] = c2[3] + fStack_814 * 1.5747;
  in_RDI[2] = c1[0] + fStack_810 * 1.5747;
  in_RDI[3] = c1[1] + fStack_80c * 1.5747;
  local_838 = (float)*(undefined8 *)in_RSI;
  fStack_834 = (float)((ulong)*(undefined8 *)in_RSI >> 0x20);
  fStack_830 = (float)*(undefined8 *)(in_RSI + 2);
  fStack_82c = (float)((ulong)*(undefined8 *)(in_RSI + 2) >> 0x20);
  *in_RSI = local_838 * -0.1873;
  in_RSI[1] = fStack_834 * -0.1873;
  in_RSI[2] = fStack_830 * -0.1873;
  in_RSI[3] = fStack_82c * -0.1873;
  r._0_4_ = (float)*(undefined8 *)in_RSI;
  r._4_4_ = (float)((ulong)*(undefined8 *)in_RSI >> 0x20);
  c3[0] = (float)*(undefined8 *)(in_RSI + 2);
  c3[1] = (float)((ulong)*(undefined8 *)(in_RSI + 2) >> 0x20);
  b._0_4_ = (float)uVar1;
  b._4_4_ = (float)((ulong)uVar1 >> 0x20);
  g._0_4_ = (float)uVar2;
  g._4_4_ = (float)((ulong)uVar2 >> 0x20);
  *in_RSI = r._0_4_ + b._0_4_;
  in_RSI[1] = r._4_4_ + b._4_4_;
  in_RSI[2] = c3[0] + g._0_4_;
  in_RSI[3] = c3[1] + g._4_4_;
  src[2][2] = (float)*(undefined8 *)in_RSI;
  src[2][3] = (float)((ulong)*(undefined8 *)in_RSI >> 0x20);
  fStack_50 = (float)*(undefined8 *)(in_RSI + 2);
  fStack_4c = (float)((ulong)*(undefined8 *)(in_RSI + 2) >> 0x20);
  *in_RSI = src[2][2] + local_818 * -0.4682;
  in_RSI[1] = src[2][3] + fStack_814 * -0.4682;
  in_RSI[2] = fStack_50 + fStack_810 * -0.4682;
  in_RSI[3] = fStack_4c + fStack_80c * -0.4682;
  local_888 = (float)uVar3;
  fStack_884 = (float)((ulong)uVar3 >> 0x20);
  fStack_880 = (float)uVar4;
  fStack_87c = (float)((ulong)uVar4 >> 0x20);
  *in_RDX = local_888 * 1.8556;
  in_RDX[1] = fStack_884 * 1.8556;
  in_RDX[2] = fStack_880 * 1.8556;
  in_RDX[3] = fStack_87c * 1.8556;
  src[0][2] = (float)*(undefined8 *)in_RDX;
  src[0][3] = (float)((ulong)*(undefined8 *)in_RDX >> 0x20);
  src[1][0] = (float)*(undefined8 *)(in_RDX + 2);
  src[1][1] = (float)((ulong)*(undefined8 *)(in_RDX + 2) >> 0x20);
  *in_RDX = src[0][2] + b._0_4_;
  in_RDX[1] = src[0][3] + b._4_4_;
  in_RDX[2] = src[1][0] + g._0_4_;
  in_RDX[3] = src[1][1] + g._4_4_;
  uVar1 = *(undefined8 *)(in_RDI + 4);
  uVar2 = *(undefined8 *)(in_RDI + 6);
  uVar3 = *(undefined8 *)(in_RSI + 4);
  uVar4 = *(undefined8 *)(in_RSI + 6);
  local_898 = (float)*(undefined8 *)(in_RDX + 4);
  fStack_894 = (float)((ulong)*(undefined8 *)(in_RDX + 4) >> 0x20);
  fStack_890 = (float)*(undefined8 *)(in_RDX + 6);
  fStack_88c = (float)((ulong)*(undefined8 *)(in_RDX + 6) >> 0x20);
  local_98 = (float)*(undefined8 *)(in_RDI + 4);
  fStack_94 = (float)((ulong)*(undefined8 *)(in_RDI + 4) >> 0x20);
  fStack_90 = (float)*(undefined8 *)(in_RDI + 6);
  fStack_8c = (float)((ulong)*(undefined8 *)(in_RDI + 6) >> 0x20);
  in_RDI[4] = local_98 + local_898 * 1.5747;
  in_RDI[5] = fStack_94 + fStack_894 * 1.5747;
  in_RDI[6] = fStack_90 + fStack_890 * 1.5747;
  in_RDI[7] = fStack_8c + fStack_88c * 1.5747;
  local_8b8 = (float)*(undefined8 *)(in_RSI + 4);
  fStack_8b4 = (float)((ulong)*(undefined8 *)(in_RSI + 4) >> 0x20);
  fStack_8b0 = (float)*(undefined8 *)(in_RSI + 6);
  fStack_8ac = (float)((ulong)*(undefined8 *)(in_RSI + 6) >> 0x20);
  in_RSI[4] = local_8b8 * -0.1873;
  in_RSI[5] = fStack_8b4 * -0.1873;
  in_RSI[6] = fStack_8b0 * -0.1873;
  in_RSI[7] = fStack_8ac * -0.1873;
  local_b8 = (float)*(undefined8 *)(in_RSI + 4);
  fStack_b4 = (float)((ulong)*(undefined8 *)(in_RSI + 4) >> 0x20);
  fStack_b0 = (float)*(undefined8 *)(in_RSI + 6);
  fStack_ac = (float)((ulong)*(undefined8 *)(in_RSI + 6) >> 0x20);
  local_c8 = (float)uVar1;
  fStack_c4 = (float)((ulong)uVar1 >> 0x20);
  fStack_c0 = (float)uVar2;
  fStack_bc = (float)((ulong)uVar2 >> 0x20);
  in_RSI[4] = local_b8 + local_c8;
  in_RSI[5] = fStack_b4 + fStack_c4;
  in_RSI[6] = fStack_b0 + fStack_c0;
  in_RSI[7] = fStack_ac + fStack_bc;
  local_d8 = (float)*(undefined8 *)(in_RSI + 4);
  fStack_d4 = (float)((ulong)*(undefined8 *)(in_RSI + 4) >> 0x20);
  fStack_d0 = (float)*(undefined8 *)(in_RSI + 6);
  fStack_cc = (float)((ulong)*(undefined8 *)(in_RSI + 6) >> 0x20);
  in_RSI[4] = local_d8 + local_898 * -0.4682;
  in_RSI[5] = fStack_d4 + fStack_894 * -0.4682;
  in_RSI[6] = fStack_d0 + fStack_890 * -0.4682;
  in_RSI[7] = fStack_cc + fStack_88c * -0.4682;
  local_908 = (float)uVar3;
  fStack_904 = (float)((ulong)uVar3 >> 0x20);
  fStack_900 = (float)uVar4;
  fStack_8fc = (float)((ulong)uVar4 >> 0x20);
  in_RDX[4] = local_908 * 1.8556;
  in_RDX[5] = fStack_904 * 1.8556;
  in_RDX[6] = fStack_900 * 1.8556;
  in_RDX[7] = fStack_8fc * 1.8556;
  local_f8 = (float)*(undefined8 *)(in_RDX + 4);
  fStack_f4 = (float)((ulong)*(undefined8 *)(in_RDX + 4) >> 0x20);
  fStack_f0 = (float)*(undefined8 *)(in_RDX + 6);
  fStack_ec = (float)((ulong)*(undefined8 *)(in_RDX + 6) >> 0x20);
  in_RDX[4] = local_f8 + local_c8;
  in_RDX[5] = fStack_f4 + fStack_c4;
  in_RDX[6] = fStack_f0 + fStack_c0;
  in_RDX[7] = fStack_ec + fStack_bc;
  uVar1 = *(undefined8 *)(in_RDI + 8);
  uVar2 = *(undefined8 *)(in_RDI + 10);
  uVar3 = *(undefined8 *)(in_RSI + 8);
  uVar4 = *(undefined8 *)(in_RSI + 10);
  local_918 = (float)*(undefined8 *)(in_RDX + 8);
  fStack_914 = (float)((ulong)*(undefined8 *)(in_RDX + 8) >> 0x20);
  fStack_910 = (float)*(undefined8 *)(in_RDX + 10);
  fStack_90c = (float)((ulong)*(undefined8 *)(in_RDX + 10) >> 0x20);
  local_118 = (float)*(undefined8 *)(in_RDI + 8);
  fStack_114 = (float)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  fStack_110 = (float)*(undefined8 *)(in_RDI + 10);
  fStack_10c = (float)((ulong)*(undefined8 *)(in_RDI + 10) >> 0x20);
  in_RDI[8] = local_118 + local_918 * 1.5747;
  in_RDI[9] = fStack_114 + fStack_914 * 1.5747;
  in_RDI[10] = fStack_110 + fStack_910 * 1.5747;
  in_RDI[0xb] = fStack_10c + fStack_90c * 1.5747;
  local_938 = (float)*(undefined8 *)(in_RSI + 8);
  fStack_934 = (float)((ulong)*(undefined8 *)(in_RSI + 8) >> 0x20);
  fStack_930 = (float)*(undefined8 *)(in_RSI + 10);
  fStack_92c = (float)((ulong)*(undefined8 *)(in_RSI + 10) >> 0x20);
  in_RSI[8] = local_938 * -0.1873;
  in_RSI[9] = fStack_934 * -0.1873;
  in_RSI[10] = fStack_930 * -0.1873;
  in_RSI[0xb] = fStack_92c * -0.1873;
  local_138 = (float)*(undefined8 *)(in_RSI + 8);
  fStack_134 = (float)((ulong)*(undefined8 *)(in_RSI + 8) >> 0x20);
  fStack_130 = (float)*(undefined8 *)(in_RSI + 10);
  fStack_12c = (float)((ulong)*(undefined8 *)(in_RSI + 10) >> 0x20);
  local_148 = (float)uVar1;
  fStack_144 = (float)((ulong)uVar1 >> 0x20);
  fStack_140 = (float)uVar2;
  fStack_13c = (float)((ulong)uVar2 >> 0x20);
  in_RSI[8] = local_138 + local_148;
  in_RSI[9] = fStack_134 + fStack_144;
  in_RSI[10] = fStack_130 + fStack_140;
  in_RSI[0xb] = fStack_12c + fStack_13c;
  local_158 = (float)*(undefined8 *)(in_RSI + 8);
  fStack_154 = (float)((ulong)*(undefined8 *)(in_RSI + 8) >> 0x20);
  fStack_150 = (float)*(undefined8 *)(in_RSI + 10);
  fStack_14c = (float)((ulong)*(undefined8 *)(in_RSI + 10) >> 0x20);
  in_RSI[8] = local_158 + local_918 * -0.4682;
  in_RSI[9] = fStack_154 + fStack_914 * -0.4682;
  in_RSI[10] = fStack_150 + fStack_910 * -0.4682;
  in_RSI[0xb] = fStack_14c + fStack_90c * -0.4682;
  local_988 = (float)uVar3;
  fStack_984 = (float)((ulong)uVar3 >> 0x20);
  fStack_980 = (float)uVar4;
  fStack_97c = (float)((ulong)uVar4 >> 0x20);
  in_RDX[8] = local_988 * 1.8556;
  in_RDX[9] = fStack_984 * 1.8556;
  in_RDX[10] = fStack_980 * 1.8556;
  in_RDX[0xb] = fStack_97c * 1.8556;
  local_178 = (float)*(undefined8 *)(in_RDX + 8);
  fStack_174 = (float)((ulong)*(undefined8 *)(in_RDX + 8) >> 0x20);
  fStack_170 = (float)*(undefined8 *)(in_RDX + 10);
  fStack_16c = (float)((ulong)*(undefined8 *)(in_RDX + 10) >> 0x20);
  in_RDX[8] = local_178 + local_148;
  in_RDX[9] = fStack_174 + fStack_144;
  in_RDX[10] = fStack_170 + fStack_140;
  in_RDX[0xb] = fStack_16c + fStack_13c;
  uVar1 = *(undefined8 *)(in_RDI + 0xc);
  uVar2 = *(undefined8 *)(in_RDI + 0xe);
  uVar3 = *(undefined8 *)(in_RSI + 0xc);
  uVar4 = *(undefined8 *)(in_RSI + 0xe);
  local_998 = (float)*(undefined8 *)(in_RDX + 0xc);
  fStack_994 = (float)((ulong)*(undefined8 *)(in_RDX + 0xc) >> 0x20);
  fStack_990 = (float)*(undefined8 *)(in_RDX + 0xe);
  fStack_98c = (float)((ulong)*(undefined8 *)(in_RDX + 0xe) >> 0x20);
  local_198 = (float)*(undefined8 *)(in_RDI + 0xc);
  fStack_194 = (float)((ulong)*(undefined8 *)(in_RDI + 0xc) >> 0x20);
  fStack_190 = (float)*(undefined8 *)(in_RDI + 0xe);
  fStack_18c = (float)((ulong)*(undefined8 *)(in_RDI + 0xe) >> 0x20);
  in_RDI[0xc] = local_198 + local_998 * 1.5747;
  in_RDI[0xd] = fStack_194 + fStack_994 * 1.5747;
  in_RDI[0xe] = fStack_190 + fStack_990 * 1.5747;
  in_RDI[0xf] = fStack_18c + fStack_98c * 1.5747;
  local_9b8 = (float)*(undefined8 *)(in_RSI + 0xc);
  fStack_9b4 = (float)((ulong)*(undefined8 *)(in_RSI + 0xc) >> 0x20);
  fStack_9b0 = (float)*(undefined8 *)(in_RSI + 0xe);
  fStack_9ac = (float)((ulong)*(undefined8 *)(in_RSI + 0xe) >> 0x20);
  in_RSI[0xc] = local_9b8 * -0.1873;
  in_RSI[0xd] = fStack_9b4 * -0.1873;
  in_RSI[0xe] = fStack_9b0 * -0.1873;
  in_RSI[0xf] = fStack_9ac * -0.1873;
  local_1b8 = (float)*(undefined8 *)(in_RSI + 0xc);
  fStack_1b4 = (float)((ulong)*(undefined8 *)(in_RSI + 0xc) >> 0x20);
  fStack_1b0 = (float)*(undefined8 *)(in_RSI + 0xe);
  fStack_1ac = (float)((ulong)*(undefined8 *)(in_RSI + 0xe) >> 0x20);
  local_1c8 = (float)uVar1;
  fStack_1c4 = (float)((ulong)uVar1 >> 0x20);
  fStack_1c0 = (float)uVar2;
  fStack_1bc = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0xc] = local_1b8 + local_1c8;
  in_RSI[0xd] = fStack_1b4 + fStack_1c4;
  in_RSI[0xe] = fStack_1b0 + fStack_1c0;
  in_RSI[0xf] = fStack_1ac + fStack_1bc;
  local_1d8 = (float)*(undefined8 *)(in_RSI + 0xc);
  fStack_1d4 = (float)((ulong)*(undefined8 *)(in_RSI + 0xc) >> 0x20);
  fStack_1d0 = (float)*(undefined8 *)(in_RSI + 0xe);
  fStack_1cc = (float)((ulong)*(undefined8 *)(in_RSI + 0xe) >> 0x20);
  in_RSI[0xc] = local_1d8 + local_998 * -0.4682;
  in_RSI[0xd] = fStack_1d4 + fStack_994 * -0.4682;
  in_RSI[0xe] = fStack_1d0 + fStack_990 * -0.4682;
  in_RSI[0xf] = fStack_1cc + fStack_98c * -0.4682;
  local_a08 = (float)uVar3;
  fStack_a04 = (float)((ulong)uVar3 >> 0x20);
  fStack_a00 = (float)uVar4;
  fStack_9fc = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0xc] = local_a08 * 1.8556;
  in_RDX[0xd] = fStack_a04 * 1.8556;
  in_RDX[0xe] = fStack_a00 * 1.8556;
  in_RDX[0xf] = fStack_9fc * 1.8556;
  local_1f8 = (float)*(undefined8 *)(in_RDX + 0xc);
  fStack_1f4 = (float)((ulong)*(undefined8 *)(in_RDX + 0xc) >> 0x20);
  fStack_1f0 = (float)*(undefined8 *)(in_RDX + 0xe);
  fStack_1ec = (float)((ulong)*(undefined8 *)(in_RDX + 0xe) >> 0x20);
  in_RDX[0xc] = local_1f8 + local_1c8;
  in_RDX[0xd] = fStack_1f4 + fStack_1c4;
  in_RDX[0xe] = fStack_1f0 + fStack_1c0;
  in_RDX[0xf] = fStack_1ec + fStack_1bc;
  uVar1 = *(undefined8 *)(in_RDI + 0x10);
  uVar2 = *(undefined8 *)(in_RDI + 0x12);
  uVar3 = *(undefined8 *)(in_RSI + 0x10);
  uVar4 = *(undefined8 *)(in_RSI + 0x12);
  local_a18 = (float)*(undefined8 *)(in_RDX + 0x10);
  fStack_a14 = (float)((ulong)*(undefined8 *)(in_RDX + 0x10) >> 0x20);
  fStack_a10 = (float)*(undefined8 *)(in_RDX + 0x12);
  fStack_a0c = (float)((ulong)*(undefined8 *)(in_RDX + 0x12) >> 0x20);
  local_218 = (float)*(undefined8 *)(in_RDI + 0x10);
  fStack_214 = (float)((ulong)*(undefined8 *)(in_RDI + 0x10) >> 0x20);
  fStack_210 = (float)*(undefined8 *)(in_RDI + 0x12);
  fStack_20c = (float)((ulong)*(undefined8 *)(in_RDI + 0x12) >> 0x20);
  in_RDI[0x10] = local_218 + local_a18 * 1.5747;
  in_RDI[0x11] = fStack_214 + fStack_a14 * 1.5747;
  in_RDI[0x12] = fStack_210 + fStack_a10 * 1.5747;
  in_RDI[0x13] = fStack_20c + fStack_a0c * 1.5747;
  local_a38 = (float)*(undefined8 *)(in_RSI + 0x10);
  fStack_a34 = (float)((ulong)*(undefined8 *)(in_RSI + 0x10) >> 0x20);
  fStack_a30 = (float)*(undefined8 *)(in_RSI + 0x12);
  fStack_a2c = (float)((ulong)*(undefined8 *)(in_RSI + 0x12) >> 0x20);
  in_RSI[0x10] = local_a38 * -0.1873;
  in_RSI[0x11] = fStack_a34 * -0.1873;
  in_RSI[0x12] = fStack_a30 * -0.1873;
  in_RSI[0x13] = fStack_a2c * -0.1873;
  local_238 = (float)*(undefined8 *)(in_RSI + 0x10);
  fStack_234 = (float)((ulong)*(undefined8 *)(in_RSI + 0x10) >> 0x20);
  fStack_230 = (float)*(undefined8 *)(in_RSI + 0x12);
  fStack_22c = (float)((ulong)*(undefined8 *)(in_RSI + 0x12) >> 0x20);
  local_248 = (float)uVar1;
  fStack_244 = (float)((ulong)uVar1 >> 0x20);
  fStack_240 = (float)uVar2;
  fStack_23c = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x10] = local_238 + local_248;
  in_RSI[0x11] = fStack_234 + fStack_244;
  in_RSI[0x12] = fStack_230 + fStack_240;
  in_RSI[0x13] = fStack_22c + fStack_23c;
  local_258 = (float)*(undefined8 *)(in_RSI + 0x10);
  fStack_254 = (float)((ulong)*(undefined8 *)(in_RSI + 0x10) >> 0x20);
  fStack_250 = (float)*(undefined8 *)(in_RSI + 0x12);
  fStack_24c = (float)((ulong)*(undefined8 *)(in_RSI + 0x12) >> 0x20);
  in_RSI[0x10] = local_258 + local_a18 * -0.4682;
  in_RSI[0x11] = fStack_254 + fStack_a14 * -0.4682;
  in_RSI[0x12] = fStack_250 + fStack_a10 * -0.4682;
  in_RSI[0x13] = fStack_24c + fStack_a0c * -0.4682;
  local_a88 = (float)uVar3;
  fStack_a84 = (float)((ulong)uVar3 >> 0x20);
  fStack_a80 = (float)uVar4;
  fStack_a7c = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x10] = local_a88 * 1.8556;
  in_RDX[0x11] = fStack_a84 * 1.8556;
  in_RDX[0x12] = fStack_a80 * 1.8556;
  in_RDX[0x13] = fStack_a7c * 1.8556;
  local_278 = (float)*(undefined8 *)(in_RDX + 0x10);
  fStack_274 = (float)((ulong)*(undefined8 *)(in_RDX + 0x10) >> 0x20);
  fStack_270 = (float)*(undefined8 *)(in_RDX + 0x12);
  fStack_26c = (float)((ulong)*(undefined8 *)(in_RDX + 0x12) >> 0x20);
  in_RDX[0x10] = local_278 + local_248;
  in_RDX[0x11] = fStack_274 + fStack_244;
  in_RDX[0x12] = fStack_270 + fStack_240;
  in_RDX[0x13] = fStack_26c + fStack_23c;
  uVar1 = *(undefined8 *)(in_RDI + 0x14);
  uVar2 = *(undefined8 *)(in_RDI + 0x16);
  uVar3 = *(undefined8 *)(in_RSI + 0x14);
  uVar4 = *(undefined8 *)(in_RSI + 0x16);
  local_a98 = (float)*(undefined8 *)(in_RDX + 0x14);
  fStack_a94 = (float)((ulong)*(undefined8 *)(in_RDX + 0x14) >> 0x20);
  fStack_a90 = (float)*(undefined8 *)(in_RDX + 0x16);
  fStack_a8c = (float)((ulong)*(undefined8 *)(in_RDX + 0x16) >> 0x20);
  local_298 = (float)*(undefined8 *)(in_RDI + 0x14);
  fStack_294 = (float)((ulong)*(undefined8 *)(in_RDI + 0x14) >> 0x20);
  fStack_290 = (float)*(undefined8 *)(in_RDI + 0x16);
  fStack_28c = (float)((ulong)*(undefined8 *)(in_RDI + 0x16) >> 0x20);
  in_RDI[0x14] = local_298 + local_a98 * 1.5747;
  in_RDI[0x15] = fStack_294 + fStack_a94 * 1.5747;
  in_RDI[0x16] = fStack_290 + fStack_a90 * 1.5747;
  in_RDI[0x17] = fStack_28c + fStack_a8c * 1.5747;
  local_ab8 = (float)*(undefined8 *)(in_RSI + 0x14);
  fStack_ab4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x14) >> 0x20);
  fStack_ab0 = (float)*(undefined8 *)(in_RSI + 0x16);
  fStack_aac = (float)((ulong)*(undefined8 *)(in_RSI + 0x16) >> 0x20);
  in_RSI[0x14] = local_ab8 * -0.1873;
  in_RSI[0x15] = fStack_ab4 * -0.1873;
  in_RSI[0x16] = fStack_ab0 * -0.1873;
  in_RSI[0x17] = fStack_aac * -0.1873;
  local_2b8 = (float)*(undefined8 *)(in_RSI + 0x14);
  fStack_2b4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x14) >> 0x20);
  fStack_2b0 = (float)*(undefined8 *)(in_RSI + 0x16);
  fStack_2ac = (float)((ulong)*(undefined8 *)(in_RSI + 0x16) >> 0x20);
  local_2c8 = (float)uVar1;
  fStack_2c4 = (float)((ulong)uVar1 >> 0x20);
  fStack_2c0 = (float)uVar2;
  fStack_2bc = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x14] = local_2b8 + local_2c8;
  in_RSI[0x15] = fStack_2b4 + fStack_2c4;
  in_RSI[0x16] = fStack_2b0 + fStack_2c0;
  in_RSI[0x17] = fStack_2ac + fStack_2bc;
  local_2d8 = (float)*(undefined8 *)(in_RSI + 0x14);
  fStack_2d4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x14) >> 0x20);
  fStack_2d0 = (float)*(undefined8 *)(in_RSI + 0x16);
  fStack_2cc = (float)((ulong)*(undefined8 *)(in_RSI + 0x16) >> 0x20);
  in_RSI[0x14] = local_2d8 + local_a98 * -0.4682;
  in_RSI[0x15] = fStack_2d4 + fStack_a94 * -0.4682;
  in_RSI[0x16] = fStack_2d0 + fStack_a90 * -0.4682;
  in_RSI[0x17] = fStack_2cc + fStack_a8c * -0.4682;
  local_b08 = (float)uVar3;
  fStack_b04 = (float)((ulong)uVar3 >> 0x20);
  fStack_b00 = (float)uVar4;
  fStack_afc = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x14] = local_b08 * 1.8556;
  in_RDX[0x15] = fStack_b04 * 1.8556;
  in_RDX[0x16] = fStack_b00 * 1.8556;
  in_RDX[0x17] = fStack_afc * 1.8556;
  local_2f8 = (float)*(undefined8 *)(in_RDX + 0x14);
  fStack_2f4 = (float)((ulong)*(undefined8 *)(in_RDX + 0x14) >> 0x20);
  fStack_2f0 = (float)*(undefined8 *)(in_RDX + 0x16);
  fStack_2ec = (float)((ulong)*(undefined8 *)(in_RDX + 0x16) >> 0x20);
  in_RDX[0x14] = local_2f8 + local_2c8;
  in_RDX[0x15] = fStack_2f4 + fStack_2c4;
  in_RDX[0x16] = fStack_2f0 + fStack_2c0;
  in_RDX[0x17] = fStack_2ec + fStack_2bc;
  uVar1 = *(undefined8 *)(in_RDI + 0x18);
  uVar2 = *(undefined8 *)(in_RDI + 0x1a);
  uVar3 = *(undefined8 *)(in_RSI + 0x18);
  uVar4 = *(undefined8 *)(in_RSI + 0x1a);
  local_b18 = (float)*(undefined8 *)(in_RDX + 0x18);
  fStack_b14 = (float)((ulong)*(undefined8 *)(in_RDX + 0x18) >> 0x20);
  fStack_b10 = (float)*(undefined8 *)(in_RDX + 0x1a);
  fStack_b0c = (float)((ulong)*(undefined8 *)(in_RDX + 0x1a) >> 0x20);
  local_318 = (float)*(undefined8 *)(in_RDI + 0x18);
  fStack_314 = (float)((ulong)*(undefined8 *)(in_RDI + 0x18) >> 0x20);
  fStack_310 = (float)*(undefined8 *)(in_RDI + 0x1a);
  fStack_30c = (float)((ulong)*(undefined8 *)(in_RDI + 0x1a) >> 0x20);
  in_RDI[0x18] = local_318 + local_b18 * 1.5747;
  in_RDI[0x19] = fStack_314 + fStack_b14 * 1.5747;
  in_RDI[0x1a] = fStack_310 + fStack_b10 * 1.5747;
  in_RDI[0x1b] = fStack_30c + fStack_b0c * 1.5747;
  local_b38 = (float)*(undefined8 *)(in_RSI + 0x18);
  fStack_b34 = (float)((ulong)*(undefined8 *)(in_RSI + 0x18) >> 0x20);
  fStack_b30 = (float)*(undefined8 *)(in_RSI + 0x1a);
  fStack_b2c = (float)((ulong)*(undefined8 *)(in_RSI + 0x1a) >> 0x20);
  in_RSI[0x18] = local_b38 * -0.1873;
  in_RSI[0x19] = fStack_b34 * -0.1873;
  in_RSI[0x1a] = fStack_b30 * -0.1873;
  in_RSI[0x1b] = fStack_b2c * -0.1873;
  local_338 = (float)*(undefined8 *)(in_RSI + 0x18);
  fStack_334 = (float)((ulong)*(undefined8 *)(in_RSI + 0x18) >> 0x20);
  fStack_330 = (float)*(undefined8 *)(in_RSI + 0x1a);
  fStack_32c = (float)((ulong)*(undefined8 *)(in_RSI + 0x1a) >> 0x20);
  local_348 = (float)uVar1;
  fStack_344 = (float)((ulong)uVar1 >> 0x20);
  fStack_340 = (float)uVar2;
  fStack_33c = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x18] = local_338 + local_348;
  in_RSI[0x19] = fStack_334 + fStack_344;
  in_RSI[0x1a] = fStack_330 + fStack_340;
  in_RSI[0x1b] = fStack_32c + fStack_33c;
  local_358 = (float)*(undefined8 *)(in_RSI + 0x18);
  fStack_354 = (float)((ulong)*(undefined8 *)(in_RSI + 0x18) >> 0x20);
  fStack_350 = (float)*(undefined8 *)(in_RSI + 0x1a);
  fStack_34c = (float)((ulong)*(undefined8 *)(in_RSI + 0x1a) >> 0x20);
  in_RSI[0x18] = local_358 + local_b18 * -0.4682;
  in_RSI[0x19] = fStack_354 + fStack_b14 * -0.4682;
  in_RSI[0x1a] = fStack_350 + fStack_b10 * -0.4682;
  in_RSI[0x1b] = fStack_34c + fStack_b0c * -0.4682;
  local_b88 = (float)uVar3;
  fStack_b84 = (float)((ulong)uVar3 >> 0x20);
  fStack_b80 = (float)uVar4;
  fStack_b7c = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x18] = local_b88 * 1.8556;
  in_RDX[0x19] = fStack_b84 * 1.8556;
  in_RDX[0x1a] = fStack_b80 * 1.8556;
  in_RDX[0x1b] = fStack_b7c * 1.8556;
  local_378 = (float)*(undefined8 *)(in_RDX + 0x18);
  fStack_374 = (float)((ulong)*(undefined8 *)(in_RDX + 0x18) >> 0x20);
  fStack_370 = (float)*(undefined8 *)(in_RDX + 0x1a);
  fStack_36c = (float)((ulong)*(undefined8 *)(in_RDX + 0x1a) >> 0x20);
  in_RDX[0x18] = local_378 + local_348;
  in_RDX[0x19] = fStack_374 + fStack_344;
  in_RDX[0x1a] = fStack_370 + fStack_340;
  in_RDX[0x1b] = fStack_36c + fStack_33c;
  uVar1 = *(undefined8 *)(in_RDI + 0x1c);
  uVar2 = *(undefined8 *)(in_RDI + 0x1e);
  uVar3 = *(undefined8 *)(in_RSI + 0x1c);
  uVar4 = *(undefined8 *)(in_RSI + 0x1e);
  local_b98 = (float)*(undefined8 *)(in_RDX + 0x1c);
  fStack_b94 = (float)((ulong)*(undefined8 *)(in_RDX + 0x1c) >> 0x20);
  fStack_b90 = (float)*(undefined8 *)(in_RDX + 0x1e);
  fStack_b8c = (float)((ulong)*(undefined8 *)(in_RDX + 0x1e) >> 0x20);
  local_398 = (float)*(undefined8 *)(in_RDI + 0x1c);
  fStack_394 = (float)((ulong)*(undefined8 *)(in_RDI + 0x1c) >> 0x20);
  fStack_390 = (float)*(undefined8 *)(in_RDI + 0x1e);
  fStack_38c = (float)((ulong)*(undefined8 *)(in_RDI + 0x1e) >> 0x20);
  in_RDI[0x1c] = local_398 + local_b98 * 1.5747;
  in_RDI[0x1d] = fStack_394 + fStack_b94 * 1.5747;
  in_RDI[0x1e] = fStack_390 + fStack_b90 * 1.5747;
  in_RDI[0x1f] = fStack_38c + fStack_b8c * 1.5747;
  local_bb8 = (float)*(undefined8 *)(in_RSI + 0x1c);
  fStack_bb4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x1c) >> 0x20);
  fStack_bb0 = (float)*(undefined8 *)(in_RSI + 0x1e);
  fStack_bac = (float)((ulong)*(undefined8 *)(in_RSI + 0x1e) >> 0x20);
  in_RSI[0x1c] = local_bb8 * -0.1873;
  in_RSI[0x1d] = fStack_bb4 * -0.1873;
  in_RSI[0x1e] = fStack_bb0 * -0.1873;
  in_RSI[0x1f] = fStack_bac * -0.1873;
  local_3b8 = (float)*(undefined8 *)(in_RSI + 0x1c);
  fStack_3b4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x1c) >> 0x20);
  fStack_3b0 = (float)*(undefined8 *)(in_RSI + 0x1e);
  fStack_3ac = (float)((ulong)*(undefined8 *)(in_RSI + 0x1e) >> 0x20);
  local_3c8 = (float)uVar1;
  fStack_3c4 = (float)((ulong)uVar1 >> 0x20);
  fStack_3c0 = (float)uVar2;
  fStack_3bc = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x1c] = local_3b8 + local_3c8;
  in_RSI[0x1d] = fStack_3b4 + fStack_3c4;
  in_RSI[0x1e] = fStack_3b0 + fStack_3c0;
  in_RSI[0x1f] = fStack_3ac + fStack_3bc;
  local_3d8 = (float)*(undefined8 *)(in_RSI + 0x1c);
  fStack_3d4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x1c) >> 0x20);
  fStack_3d0 = (float)*(undefined8 *)(in_RSI + 0x1e);
  fStack_3cc = (float)((ulong)*(undefined8 *)(in_RSI + 0x1e) >> 0x20);
  in_RSI[0x1c] = local_3d8 + local_b98 * -0.4682;
  in_RSI[0x1d] = fStack_3d4 + fStack_b94 * -0.4682;
  in_RSI[0x1e] = fStack_3d0 + fStack_b90 * -0.4682;
  in_RSI[0x1f] = fStack_3cc + fStack_b8c * -0.4682;
  local_c08 = (float)uVar3;
  fStack_c04 = (float)((ulong)uVar3 >> 0x20);
  fStack_c00 = (float)uVar4;
  fStack_bfc = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x1c] = local_c08 * 1.8556;
  in_RDX[0x1d] = fStack_c04 * 1.8556;
  in_RDX[0x1e] = fStack_c00 * 1.8556;
  in_RDX[0x1f] = fStack_bfc * 1.8556;
  local_3f8 = (float)*(undefined8 *)(in_RDX + 0x1c);
  fStack_3f4 = (float)((ulong)*(undefined8 *)(in_RDX + 0x1c) >> 0x20);
  fStack_3f0 = (float)*(undefined8 *)(in_RDX + 0x1e);
  fStack_3ec = (float)((ulong)*(undefined8 *)(in_RDX + 0x1e) >> 0x20);
  in_RDX[0x1c] = local_3f8 + local_3c8;
  in_RDX[0x1d] = fStack_3f4 + fStack_3c4;
  in_RDX[0x1e] = fStack_3f0 + fStack_3c0;
  in_RDX[0x1f] = fStack_3ec + fStack_3bc;
  uVar1 = *(undefined8 *)(in_RDI + 0x20);
  uVar2 = *(undefined8 *)(in_RDI + 0x22);
  uVar3 = *(undefined8 *)(in_RSI + 0x20);
  uVar4 = *(undefined8 *)(in_RSI + 0x22);
  local_c18 = (float)*(undefined8 *)(in_RDX + 0x20);
  fStack_c14 = (float)((ulong)*(undefined8 *)(in_RDX + 0x20) >> 0x20);
  fStack_c10 = (float)*(undefined8 *)(in_RDX + 0x22);
  fStack_c0c = (float)((ulong)*(undefined8 *)(in_RDX + 0x22) >> 0x20);
  local_418 = (float)*(undefined8 *)(in_RDI + 0x20);
  fStack_414 = (float)((ulong)*(undefined8 *)(in_RDI + 0x20) >> 0x20);
  fStack_410 = (float)*(undefined8 *)(in_RDI + 0x22);
  fStack_40c = (float)((ulong)*(undefined8 *)(in_RDI + 0x22) >> 0x20);
  in_RDI[0x20] = local_418 + local_c18 * 1.5747;
  in_RDI[0x21] = fStack_414 + fStack_c14 * 1.5747;
  in_RDI[0x22] = fStack_410 + fStack_c10 * 1.5747;
  in_RDI[0x23] = fStack_40c + fStack_c0c * 1.5747;
  local_c38 = (float)*(undefined8 *)(in_RSI + 0x20);
  fStack_c34 = (float)((ulong)*(undefined8 *)(in_RSI + 0x20) >> 0x20);
  fStack_c30 = (float)*(undefined8 *)(in_RSI + 0x22);
  fStack_c2c = (float)((ulong)*(undefined8 *)(in_RSI + 0x22) >> 0x20);
  in_RSI[0x20] = local_c38 * -0.1873;
  in_RSI[0x21] = fStack_c34 * -0.1873;
  in_RSI[0x22] = fStack_c30 * -0.1873;
  in_RSI[0x23] = fStack_c2c * -0.1873;
  local_438 = (float)*(undefined8 *)(in_RSI + 0x20);
  fStack_434 = (float)((ulong)*(undefined8 *)(in_RSI + 0x20) >> 0x20);
  fStack_430 = (float)*(undefined8 *)(in_RSI + 0x22);
  fStack_42c = (float)((ulong)*(undefined8 *)(in_RSI + 0x22) >> 0x20);
  local_448 = (float)uVar1;
  fStack_444 = (float)((ulong)uVar1 >> 0x20);
  fStack_440 = (float)uVar2;
  fStack_43c = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x20] = local_438 + local_448;
  in_RSI[0x21] = fStack_434 + fStack_444;
  in_RSI[0x22] = fStack_430 + fStack_440;
  in_RSI[0x23] = fStack_42c + fStack_43c;
  local_458 = (float)*(undefined8 *)(in_RSI + 0x20);
  fStack_454 = (float)((ulong)*(undefined8 *)(in_RSI + 0x20) >> 0x20);
  fStack_450 = (float)*(undefined8 *)(in_RSI + 0x22);
  fStack_44c = (float)((ulong)*(undefined8 *)(in_RSI + 0x22) >> 0x20);
  in_RSI[0x20] = local_458 + local_c18 * -0.4682;
  in_RSI[0x21] = fStack_454 + fStack_c14 * -0.4682;
  in_RSI[0x22] = fStack_450 + fStack_c10 * -0.4682;
  in_RSI[0x23] = fStack_44c + fStack_c0c * -0.4682;
  local_c88 = (float)uVar3;
  fStack_c84 = (float)((ulong)uVar3 >> 0x20);
  fStack_c80 = (float)uVar4;
  fStack_c7c = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x20] = local_c88 * 1.8556;
  in_RDX[0x21] = fStack_c84 * 1.8556;
  in_RDX[0x22] = fStack_c80 * 1.8556;
  in_RDX[0x23] = fStack_c7c * 1.8556;
  local_478 = (float)*(undefined8 *)(in_RDX + 0x20);
  fStack_474 = (float)((ulong)*(undefined8 *)(in_RDX + 0x20) >> 0x20);
  fStack_470 = (float)*(undefined8 *)(in_RDX + 0x22);
  fStack_46c = (float)((ulong)*(undefined8 *)(in_RDX + 0x22) >> 0x20);
  in_RDX[0x20] = local_478 + local_448;
  in_RDX[0x21] = fStack_474 + fStack_444;
  in_RDX[0x22] = fStack_470 + fStack_440;
  in_RDX[0x23] = fStack_46c + fStack_43c;
  uVar1 = *(undefined8 *)(in_RDI + 0x24);
  uVar2 = *(undefined8 *)(in_RDI + 0x26);
  uVar3 = *(undefined8 *)(in_RSI + 0x24);
  uVar4 = *(undefined8 *)(in_RSI + 0x26);
  local_c98 = (float)*(undefined8 *)(in_RDX + 0x24);
  fStack_c94 = (float)((ulong)*(undefined8 *)(in_RDX + 0x24) >> 0x20);
  fStack_c90 = (float)*(undefined8 *)(in_RDX + 0x26);
  fStack_c8c = (float)((ulong)*(undefined8 *)(in_RDX + 0x26) >> 0x20);
  local_498 = (float)*(undefined8 *)(in_RDI + 0x24);
  fStack_494 = (float)((ulong)*(undefined8 *)(in_RDI + 0x24) >> 0x20);
  fStack_490 = (float)*(undefined8 *)(in_RDI + 0x26);
  fStack_48c = (float)((ulong)*(undefined8 *)(in_RDI + 0x26) >> 0x20);
  in_RDI[0x24] = local_498 + local_c98 * 1.5747;
  in_RDI[0x25] = fStack_494 + fStack_c94 * 1.5747;
  in_RDI[0x26] = fStack_490 + fStack_c90 * 1.5747;
  in_RDI[0x27] = fStack_48c + fStack_c8c * 1.5747;
  local_cb8 = (float)*(undefined8 *)(in_RSI + 0x24);
  fStack_cb4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x24) >> 0x20);
  fStack_cb0 = (float)*(undefined8 *)(in_RSI + 0x26);
  fStack_cac = (float)((ulong)*(undefined8 *)(in_RSI + 0x26) >> 0x20);
  in_RSI[0x24] = local_cb8 * -0.1873;
  in_RSI[0x25] = fStack_cb4 * -0.1873;
  in_RSI[0x26] = fStack_cb0 * -0.1873;
  in_RSI[0x27] = fStack_cac * -0.1873;
  local_4b8 = (float)*(undefined8 *)(in_RSI + 0x24);
  fStack_4b4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x24) >> 0x20);
  fStack_4b0 = (float)*(undefined8 *)(in_RSI + 0x26);
  fStack_4ac = (float)((ulong)*(undefined8 *)(in_RSI + 0x26) >> 0x20);
  local_4c8 = (float)uVar1;
  fStack_4c4 = (float)((ulong)uVar1 >> 0x20);
  fStack_4c0 = (float)uVar2;
  fStack_4bc = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x24] = local_4b8 + local_4c8;
  in_RSI[0x25] = fStack_4b4 + fStack_4c4;
  in_RSI[0x26] = fStack_4b0 + fStack_4c0;
  in_RSI[0x27] = fStack_4ac + fStack_4bc;
  local_4d8 = (float)*(undefined8 *)(in_RSI + 0x24);
  fStack_4d4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x24) >> 0x20);
  fStack_4d0 = (float)*(undefined8 *)(in_RSI + 0x26);
  fStack_4cc = (float)((ulong)*(undefined8 *)(in_RSI + 0x26) >> 0x20);
  in_RSI[0x24] = local_4d8 + local_c98 * -0.4682;
  in_RSI[0x25] = fStack_4d4 + fStack_c94 * -0.4682;
  in_RSI[0x26] = fStack_4d0 + fStack_c90 * -0.4682;
  in_RSI[0x27] = fStack_4cc + fStack_c8c * -0.4682;
  local_d08 = (float)uVar3;
  fStack_d04 = (float)((ulong)uVar3 >> 0x20);
  fStack_d00 = (float)uVar4;
  fStack_cfc = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x24] = local_d08 * 1.8556;
  in_RDX[0x25] = fStack_d04 * 1.8556;
  in_RDX[0x26] = fStack_d00 * 1.8556;
  in_RDX[0x27] = fStack_cfc * 1.8556;
  local_4f8 = (float)*(undefined8 *)(in_RDX + 0x24);
  fStack_4f4 = (float)((ulong)*(undefined8 *)(in_RDX + 0x24) >> 0x20);
  fStack_4f0 = (float)*(undefined8 *)(in_RDX + 0x26);
  fStack_4ec = (float)((ulong)*(undefined8 *)(in_RDX + 0x26) >> 0x20);
  in_RDX[0x24] = local_4f8 + local_4c8;
  in_RDX[0x25] = fStack_4f4 + fStack_4c4;
  in_RDX[0x26] = fStack_4f0 + fStack_4c0;
  in_RDX[0x27] = fStack_4ec + fStack_4bc;
  uVar1 = *(undefined8 *)(in_RDI + 0x28);
  uVar2 = *(undefined8 *)(in_RDI + 0x2a);
  uVar3 = *(undefined8 *)(in_RSI + 0x28);
  uVar4 = *(undefined8 *)(in_RSI + 0x2a);
  local_d18 = (float)*(undefined8 *)(in_RDX + 0x28);
  fStack_d14 = (float)((ulong)*(undefined8 *)(in_RDX + 0x28) >> 0x20);
  fStack_d10 = (float)*(undefined8 *)(in_RDX + 0x2a);
  fStack_d0c = (float)((ulong)*(undefined8 *)(in_RDX + 0x2a) >> 0x20);
  local_518 = (float)*(undefined8 *)(in_RDI + 0x28);
  fStack_514 = (float)((ulong)*(undefined8 *)(in_RDI + 0x28) >> 0x20);
  fStack_510 = (float)*(undefined8 *)(in_RDI + 0x2a);
  fStack_50c = (float)((ulong)*(undefined8 *)(in_RDI + 0x2a) >> 0x20);
  in_RDI[0x28] = local_518 + local_d18 * 1.5747;
  in_RDI[0x29] = fStack_514 + fStack_d14 * 1.5747;
  in_RDI[0x2a] = fStack_510 + fStack_d10 * 1.5747;
  in_RDI[0x2b] = fStack_50c + fStack_d0c * 1.5747;
  local_d38 = (float)*(undefined8 *)(in_RSI + 0x28);
  fStack_d34 = (float)((ulong)*(undefined8 *)(in_RSI + 0x28) >> 0x20);
  fStack_d30 = (float)*(undefined8 *)(in_RSI + 0x2a);
  fStack_d2c = (float)((ulong)*(undefined8 *)(in_RSI + 0x2a) >> 0x20);
  in_RSI[0x28] = local_d38 * -0.1873;
  in_RSI[0x29] = fStack_d34 * -0.1873;
  in_RSI[0x2a] = fStack_d30 * -0.1873;
  in_RSI[0x2b] = fStack_d2c * -0.1873;
  local_538 = (float)*(undefined8 *)(in_RSI + 0x28);
  fStack_534 = (float)((ulong)*(undefined8 *)(in_RSI + 0x28) >> 0x20);
  fStack_530 = (float)*(undefined8 *)(in_RSI + 0x2a);
  fStack_52c = (float)((ulong)*(undefined8 *)(in_RSI + 0x2a) >> 0x20);
  local_548 = (float)uVar1;
  fStack_544 = (float)((ulong)uVar1 >> 0x20);
  fStack_540 = (float)uVar2;
  fStack_53c = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x28] = local_538 + local_548;
  in_RSI[0x29] = fStack_534 + fStack_544;
  in_RSI[0x2a] = fStack_530 + fStack_540;
  in_RSI[0x2b] = fStack_52c + fStack_53c;
  local_558 = (float)*(undefined8 *)(in_RSI + 0x28);
  fStack_554 = (float)((ulong)*(undefined8 *)(in_RSI + 0x28) >> 0x20);
  fStack_550 = (float)*(undefined8 *)(in_RSI + 0x2a);
  fStack_54c = (float)((ulong)*(undefined8 *)(in_RSI + 0x2a) >> 0x20);
  in_RSI[0x28] = local_558 + local_d18 * -0.4682;
  in_RSI[0x29] = fStack_554 + fStack_d14 * -0.4682;
  in_RSI[0x2a] = fStack_550 + fStack_d10 * -0.4682;
  in_RSI[0x2b] = fStack_54c + fStack_d0c * -0.4682;
  local_d88 = (float)uVar3;
  fStack_d84 = (float)((ulong)uVar3 >> 0x20);
  fStack_d80 = (float)uVar4;
  fStack_d7c = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x28] = local_d88 * 1.8556;
  in_RDX[0x29] = fStack_d84 * 1.8556;
  in_RDX[0x2a] = fStack_d80 * 1.8556;
  in_RDX[0x2b] = fStack_d7c * 1.8556;
  local_578 = (float)*(undefined8 *)(in_RDX + 0x28);
  fStack_574 = (float)((ulong)*(undefined8 *)(in_RDX + 0x28) >> 0x20);
  fStack_570 = (float)*(undefined8 *)(in_RDX + 0x2a);
  fStack_56c = (float)((ulong)*(undefined8 *)(in_RDX + 0x2a) >> 0x20);
  in_RDX[0x28] = local_578 + local_548;
  in_RDX[0x29] = fStack_574 + fStack_544;
  in_RDX[0x2a] = fStack_570 + fStack_540;
  in_RDX[0x2b] = fStack_56c + fStack_53c;
  uVar1 = *(undefined8 *)(in_RDI + 0x2c);
  uVar2 = *(undefined8 *)(in_RDI + 0x2e);
  uVar3 = *(undefined8 *)(in_RSI + 0x2c);
  uVar4 = *(undefined8 *)(in_RSI + 0x2e);
  local_d98 = (float)*(undefined8 *)(in_RDX + 0x2c);
  fStack_d94 = (float)((ulong)*(undefined8 *)(in_RDX + 0x2c) >> 0x20);
  fStack_d90 = (float)*(undefined8 *)(in_RDX + 0x2e);
  fStack_d8c = (float)((ulong)*(undefined8 *)(in_RDX + 0x2e) >> 0x20);
  local_598 = (float)*(undefined8 *)(in_RDI + 0x2c);
  fStack_594 = (float)((ulong)*(undefined8 *)(in_RDI + 0x2c) >> 0x20);
  fStack_590 = (float)*(undefined8 *)(in_RDI + 0x2e);
  fStack_58c = (float)((ulong)*(undefined8 *)(in_RDI + 0x2e) >> 0x20);
  in_RDI[0x2c] = local_598 + local_d98 * 1.5747;
  in_RDI[0x2d] = fStack_594 + fStack_d94 * 1.5747;
  in_RDI[0x2e] = fStack_590 + fStack_d90 * 1.5747;
  in_RDI[0x2f] = fStack_58c + fStack_d8c * 1.5747;
  local_db8 = (float)*(undefined8 *)(in_RSI + 0x2c);
  fStack_db4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x2c) >> 0x20);
  fStack_db0 = (float)*(undefined8 *)(in_RSI + 0x2e);
  fStack_dac = (float)((ulong)*(undefined8 *)(in_RSI + 0x2e) >> 0x20);
  in_RSI[0x2c] = local_db8 * -0.1873;
  in_RSI[0x2d] = fStack_db4 * -0.1873;
  in_RSI[0x2e] = fStack_db0 * -0.1873;
  in_RSI[0x2f] = fStack_dac * -0.1873;
  local_5b8 = (float)*(undefined8 *)(in_RSI + 0x2c);
  fStack_5b4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x2c) >> 0x20);
  fStack_5b0 = (float)*(undefined8 *)(in_RSI + 0x2e);
  fStack_5ac = (float)((ulong)*(undefined8 *)(in_RSI + 0x2e) >> 0x20);
  local_5c8 = (float)uVar1;
  fStack_5c4 = (float)((ulong)uVar1 >> 0x20);
  fStack_5c0 = (float)uVar2;
  fStack_5bc = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x2c] = local_5b8 + local_5c8;
  in_RSI[0x2d] = fStack_5b4 + fStack_5c4;
  in_RSI[0x2e] = fStack_5b0 + fStack_5c0;
  in_RSI[0x2f] = fStack_5ac + fStack_5bc;
  local_5d8 = (float)*(undefined8 *)(in_RSI + 0x2c);
  fStack_5d4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x2c) >> 0x20);
  fStack_5d0 = (float)*(undefined8 *)(in_RSI + 0x2e);
  fStack_5cc = (float)((ulong)*(undefined8 *)(in_RSI + 0x2e) >> 0x20);
  in_RSI[0x2c] = local_5d8 + local_d98 * -0.4682;
  in_RSI[0x2d] = fStack_5d4 + fStack_d94 * -0.4682;
  in_RSI[0x2e] = fStack_5d0 + fStack_d90 * -0.4682;
  in_RSI[0x2f] = fStack_5cc + fStack_d8c * -0.4682;
  local_e08 = (float)uVar3;
  fStack_e04 = (float)((ulong)uVar3 >> 0x20);
  fStack_e00 = (float)uVar4;
  fStack_dfc = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x2c] = local_e08 * 1.8556;
  in_RDX[0x2d] = fStack_e04 * 1.8556;
  in_RDX[0x2e] = fStack_e00 * 1.8556;
  in_RDX[0x2f] = fStack_dfc * 1.8556;
  local_5f8 = (float)*(undefined8 *)(in_RDX + 0x2c);
  fStack_5f4 = (float)((ulong)*(undefined8 *)(in_RDX + 0x2c) >> 0x20);
  fStack_5f0 = (float)*(undefined8 *)(in_RDX + 0x2e);
  fStack_5ec = (float)((ulong)*(undefined8 *)(in_RDX + 0x2e) >> 0x20);
  in_RDX[0x2c] = local_5f8 + local_5c8;
  in_RDX[0x2d] = fStack_5f4 + fStack_5c4;
  in_RDX[0x2e] = fStack_5f0 + fStack_5c0;
  in_RDX[0x2f] = fStack_5ec + fStack_5bc;
  uVar1 = *(undefined8 *)(in_RDI + 0x30);
  uVar2 = *(undefined8 *)(in_RDI + 0x32);
  uVar3 = *(undefined8 *)(in_RSI + 0x30);
  uVar4 = *(undefined8 *)(in_RSI + 0x32);
  local_e18 = (float)*(undefined8 *)(in_RDX + 0x30);
  fStack_e14 = (float)((ulong)*(undefined8 *)(in_RDX + 0x30) >> 0x20);
  fStack_e10 = (float)*(undefined8 *)(in_RDX + 0x32);
  fStack_e0c = (float)((ulong)*(undefined8 *)(in_RDX + 0x32) >> 0x20);
  local_618 = (float)*(undefined8 *)(in_RDI + 0x30);
  fStack_614 = (float)((ulong)*(undefined8 *)(in_RDI + 0x30) >> 0x20);
  fStack_610 = (float)*(undefined8 *)(in_RDI + 0x32);
  fStack_60c = (float)((ulong)*(undefined8 *)(in_RDI + 0x32) >> 0x20);
  in_RDI[0x30] = local_618 + local_e18 * 1.5747;
  in_RDI[0x31] = fStack_614 + fStack_e14 * 1.5747;
  in_RDI[0x32] = fStack_610 + fStack_e10 * 1.5747;
  in_RDI[0x33] = fStack_60c + fStack_e0c * 1.5747;
  local_e38 = (float)*(undefined8 *)(in_RSI + 0x30);
  fStack_e34 = (float)((ulong)*(undefined8 *)(in_RSI + 0x30) >> 0x20);
  fStack_e30 = (float)*(undefined8 *)(in_RSI + 0x32);
  fStack_e2c = (float)((ulong)*(undefined8 *)(in_RSI + 0x32) >> 0x20);
  in_RSI[0x30] = local_e38 * -0.1873;
  in_RSI[0x31] = fStack_e34 * -0.1873;
  in_RSI[0x32] = fStack_e30 * -0.1873;
  in_RSI[0x33] = fStack_e2c * -0.1873;
  local_638 = (float)*(undefined8 *)(in_RSI + 0x30);
  fStack_634 = (float)((ulong)*(undefined8 *)(in_RSI + 0x30) >> 0x20);
  fStack_630 = (float)*(undefined8 *)(in_RSI + 0x32);
  fStack_62c = (float)((ulong)*(undefined8 *)(in_RSI + 0x32) >> 0x20);
  local_648 = (float)uVar1;
  fStack_644 = (float)((ulong)uVar1 >> 0x20);
  fStack_640 = (float)uVar2;
  fStack_63c = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x30] = local_638 + local_648;
  in_RSI[0x31] = fStack_634 + fStack_644;
  in_RSI[0x32] = fStack_630 + fStack_640;
  in_RSI[0x33] = fStack_62c + fStack_63c;
  local_658 = (float)*(undefined8 *)(in_RSI + 0x30);
  fStack_654 = (float)((ulong)*(undefined8 *)(in_RSI + 0x30) >> 0x20);
  fStack_650 = (float)*(undefined8 *)(in_RSI + 0x32);
  fStack_64c = (float)((ulong)*(undefined8 *)(in_RSI + 0x32) >> 0x20);
  in_RSI[0x30] = local_658 + local_e18 * -0.4682;
  in_RSI[0x31] = fStack_654 + fStack_e14 * -0.4682;
  in_RSI[0x32] = fStack_650 + fStack_e10 * -0.4682;
  in_RSI[0x33] = fStack_64c + fStack_e0c * -0.4682;
  local_e88 = (float)uVar3;
  fStack_e84 = (float)((ulong)uVar3 >> 0x20);
  fStack_e80 = (float)uVar4;
  fStack_e7c = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x30] = local_e88 * 1.8556;
  in_RDX[0x31] = fStack_e84 * 1.8556;
  in_RDX[0x32] = fStack_e80 * 1.8556;
  in_RDX[0x33] = fStack_e7c * 1.8556;
  local_678 = (float)*(undefined8 *)(in_RDX + 0x30);
  fStack_674 = (float)((ulong)*(undefined8 *)(in_RDX + 0x30) >> 0x20);
  fStack_670 = (float)*(undefined8 *)(in_RDX + 0x32);
  fStack_66c = (float)((ulong)*(undefined8 *)(in_RDX + 0x32) >> 0x20);
  in_RDX[0x30] = local_678 + local_648;
  in_RDX[0x31] = fStack_674 + fStack_644;
  in_RDX[0x32] = fStack_670 + fStack_640;
  in_RDX[0x33] = fStack_66c + fStack_63c;
  uVar1 = *(undefined8 *)(in_RDI + 0x34);
  uVar2 = *(undefined8 *)(in_RDI + 0x36);
  uVar3 = *(undefined8 *)(in_RSI + 0x34);
  uVar4 = *(undefined8 *)(in_RSI + 0x36);
  local_e98 = (float)*(undefined8 *)(in_RDX + 0x34);
  fStack_e94 = (float)((ulong)*(undefined8 *)(in_RDX + 0x34) >> 0x20);
  fStack_e90 = (float)*(undefined8 *)(in_RDX + 0x36);
  fStack_e8c = (float)((ulong)*(undefined8 *)(in_RDX + 0x36) >> 0x20);
  local_698 = (float)*(undefined8 *)(in_RDI + 0x34);
  fStack_694 = (float)((ulong)*(undefined8 *)(in_RDI + 0x34) >> 0x20);
  fStack_690 = (float)*(undefined8 *)(in_RDI + 0x36);
  fStack_68c = (float)((ulong)*(undefined8 *)(in_RDI + 0x36) >> 0x20);
  in_RDI[0x34] = local_698 + local_e98 * 1.5747;
  in_RDI[0x35] = fStack_694 + fStack_e94 * 1.5747;
  in_RDI[0x36] = fStack_690 + fStack_e90 * 1.5747;
  in_RDI[0x37] = fStack_68c + fStack_e8c * 1.5747;
  local_eb8 = (float)*(undefined8 *)(in_RSI + 0x34);
  fStack_eb4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x34) >> 0x20);
  fStack_eb0 = (float)*(undefined8 *)(in_RSI + 0x36);
  fStack_eac = (float)((ulong)*(undefined8 *)(in_RSI + 0x36) >> 0x20);
  in_RSI[0x34] = local_eb8 * -0.1873;
  in_RSI[0x35] = fStack_eb4 * -0.1873;
  in_RSI[0x36] = fStack_eb0 * -0.1873;
  in_RSI[0x37] = fStack_eac * -0.1873;
  local_6b8 = (float)*(undefined8 *)(in_RSI + 0x34);
  fStack_6b4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x34) >> 0x20);
  fStack_6b0 = (float)*(undefined8 *)(in_RSI + 0x36);
  fStack_6ac = (float)((ulong)*(undefined8 *)(in_RSI + 0x36) >> 0x20);
  local_6c8 = (float)uVar1;
  fStack_6c4 = (float)((ulong)uVar1 >> 0x20);
  fStack_6c0 = (float)uVar2;
  fStack_6bc = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x34] = local_6b8 + local_6c8;
  in_RSI[0x35] = fStack_6b4 + fStack_6c4;
  in_RSI[0x36] = fStack_6b0 + fStack_6c0;
  in_RSI[0x37] = fStack_6ac + fStack_6bc;
  local_6d8 = (float)*(undefined8 *)(in_RSI + 0x34);
  fStack_6d4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x34) >> 0x20);
  fStack_6d0 = (float)*(undefined8 *)(in_RSI + 0x36);
  fStack_6cc = (float)((ulong)*(undefined8 *)(in_RSI + 0x36) >> 0x20);
  in_RSI[0x34] = local_6d8 + local_e98 * -0.4682;
  in_RSI[0x35] = fStack_6d4 + fStack_e94 * -0.4682;
  in_RSI[0x36] = fStack_6d0 + fStack_e90 * -0.4682;
  in_RSI[0x37] = fStack_6cc + fStack_e8c * -0.4682;
  local_f08 = (float)uVar3;
  fStack_f04 = (float)((ulong)uVar3 >> 0x20);
  fStack_f00 = (float)uVar4;
  fStack_efc = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x34] = local_f08 * 1.8556;
  in_RDX[0x35] = fStack_f04 * 1.8556;
  in_RDX[0x36] = fStack_f00 * 1.8556;
  in_RDX[0x37] = fStack_efc * 1.8556;
  local_6f8 = (float)*(undefined8 *)(in_RDX + 0x34);
  fStack_6f4 = (float)((ulong)*(undefined8 *)(in_RDX + 0x34) >> 0x20);
  fStack_6f0 = (float)*(undefined8 *)(in_RDX + 0x36);
  fStack_6ec = (float)((ulong)*(undefined8 *)(in_RDX + 0x36) >> 0x20);
  in_RDX[0x34] = local_6f8 + local_6c8;
  in_RDX[0x35] = fStack_6f4 + fStack_6c4;
  in_RDX[0x36] = fStack_6f0 + fStack_6c0;
  in_RDX[0x37] = fStack_6ec + fStack_6bc;
  uVar1 = *(undefined8 *)(in_RDI + 0x38);
  uVar2 = *(undefined8 *)(in_RDI + 0x3a);
  uVar3 = *(undefined8 *)(in_RSI + 0x38);
  uVar4 = *(undefined8 *)(in_RSI + 0x3a);
  local_f18 = (float)*(undefined8 *)(in_RDX + 0x38);
  fStack_f14 = (float)((ulong)*(undefined8 *)(in_RDX + 0x38) >> 0x20);
  fStack_f10 = (float)*(undefined8 *)(in_RDX + 0x3a);
  fStack_f0c = (float)((ulong)*(undefined8 *)(in_RDX + 0x3a) >> 0x20);
  local_718 = (float)*(undefined8 *)(in_RDI + 0x38);
  fStack_714 = (float)((ulong)*(undefined8 *)(in_RDI + 0x38) >> 0x20);
  fStack_710 = (float)*(undefined8 *)(in_RDI + 0x3a);
  fStack_70c = (float)((ulong)*(undefined8 *)(in_RDI + 0x3a) >> 0x20);
  in_RDI[0x38] = local_718 + local_f18 * 1.5747;
  in_RDI[0x39] = fStack_714 + fStack_f14 * 1.5747;
  in_RDI[0x3a] = fStack_710 + fStack_f10 * 1.5747;
  in_RDI[0x3b] = fStack_70c + fStack_f0c * 1.5747;
  local_f38 = (float)*(undefined8 *)(in_RSI + 0x38);
  fStack_f34 = (float)((ulong)*(undefined8 *)(in_RSI + 0x38) >> 0x20);
  fStack_f30 = (float)*(undefined8 *)(in_RSI + 0x3a);
  fStack_f2c = (float)((ulong)*(undefined8 *)(in_RSI + 0x3a) >> 0x20);
  in_RSI[0x38] = local_f38 * -0.1873;
  in_RSI[0x39] = fStack_f34 * -0.1873;
  in_RSI[0x3a] = fStack_f30 * -0.1873;
  in_RSI[0x3b] = fStack_f2c * -0.1873;
  local_738 = (float)*(undefined8 *)(in_RSI + 0x38);
  fStack_734 = (float)((ulong)*(undefined8 *)(in_RSI + 0x38) >> 0x20);
  fStack_730 = (float)*(undefined8 *)(in_RSI + 0x3a);
  fStack_72c = (float)((ulong)*(undefined8 *)(in_RSI + 0x3a) >> 0x20);
  local_748 = (float)uVar1;
  fStack_744 = (float)((ulong)uVar1 >> 0x20);
  fStack_740 = (float)uVar2;
  fStack_73c = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x38] = local_738 + local_748;
  in_RSI[0x39] = fStack_734 + fStack_744;
  in_RSI[0x3a] = fStack_730 + fStack_740;
  in_RSI[0x3b] = fStack_72c + fStack_73c;
  local_758 = (float)*(undefined8 *)(in_RSI + 0x38);
  fStack_754 = (float)((ulong)*(undefined8 *)(in_RSI + 0x38) >> 0x20);
  fStack_750 = (float)*(undefined8 *)(in_RSI + 0x3a);
  fStack_74c = (float)((ulong)*(undefined8 *)(in_RSI + 0x3a) >> 0x20);
  in_RSI[0x38] = local_758 + local_f18 * -0.4682;
  in_RSI[0x39] = fStack_754 + fStack_f14 * -0.4682;
  in_RSI[0x3a] = fStack_750 + fStack_f10 * -0.4682;
  in_RSI[0x3b] = fStack_74c + fStack_f0c * -0.4682;
  local_f88 = (float)uVar3;
  fStack_f84 = (float)((ulong)uVar3 >> 0x20);
  fStack_f80 = (float)uVar4;
  fStack_f7c = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x38] = local_f88 * 1.8556;
  in_RDX[0x39] = fStack_f84 * 1.8556;
  in_RDX[0x3a] = fStack_f80 * 1.8556;
  in_RDX[0x3b] = fStack_f7c * 1.8556;
  local_778 = (float)*(undefined8 *)(in_RDX + 0x38);
  fStack_774 = (float)((ulong)*(undefined8 *)(in_RDX + 0x38) >> 0x20);
  fStack_770 = (float)*(undefined8 *)(in_RDX + 0x3a);
  fStack_76c = (float)((ulong)*(undefined8 *)(in_RDX + 0x3a) >> 0x20);
  in_RDX[0x38] = local_778 + local_748;
  in_RDX[0x39] = fStack_774 + fStack_744;
  in_RDX[0x3a] = fStack_770 + fStack_740;
  in_RDX[0x3b] = fStack_76c + fStack_73c;
  uVar1 = *(undefined8 *)(in_RDI + 0x3c);
  uVar2 = *(undefined8 *)(in_RDI + 0x3e);
  uVar3 = *(undefined8 *)(in_RSI + 0x3c);
  uVar4 = *(undefined8 *)(in_RSI + 0x3e);
  local_f98 = (float)*(undefined8 *)(in_RDX + 0x3c);
  fStack_f94 = (float)((ulong)*(undefined8 *)(in_RDX + 0x3c) >> 0x20);
  fStack_f90 = (float)*(undefined8 *)(in_RDX + 0x3e);
  fStack_f8c = (float)((ulong)*(undefined8 *)(in_RDX + 0x3e) >> 0x20);
  local_798 = (float)*(undefined8 *)(in_RDI + 0x3c);
  fStack_794 = (float)((ulong)*(undefined8 *)(in_RDI + 0x3c) >> 0x20);
  fStack_790 = (float)*(undefined8 *)(in_RDI + 0x3e);
  fStack_78c = (float)((ulong)*(undefined8 *)(in_RDI + 0x3e) >> 0x20);
  in_RDI[0x3c] = local_798 + local_f98 * 1.5747;
  in_RDI[0x3d] = fStack_794 + fStack_f94 * 1.5747;
  in_RDI[0x3e] = fStack_790 + fStack_f90 * 1.5747;
  in_RDI[0x3f] = fStack_78c + fStack_f8c * 1.5747;
  local_fb8 = (float)*(undefined8 *)(in_RSI + 0x3c);
  fStack_fb4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x3c) >> 0x20);
  fStack_fb0 = (float)*(undefined8 *)(in_RSI + 0x3e);
  fStack_fac = (float)((ulong)*(undefined8 *)(in_RSI + 0x3e) >> 0x20);
  in_RSI[0x3c] = local_fb8 * -0.1873;
  in_RSI[0x3d] = fStack_fb4 * -0.1873;
  in_RSI[0x3e] = fStack_fb0 * -0.1873;
  in_RSI[0x3f] = fStack_fac * -0.1873;
  local_7b8 = (float)*(undefined8 *)(in_RSI + 0x3c);
  fStack_7b4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x3c) >> 0x20);
  fStack_7b0 = (float)*(undefined8 *)(in_RSI + 0x3e);
  fStack_7ac = (float)((ulong)*(undefined8 *)(in_RSI + 0x3e) >> 0x20);
  local_7c8 = (float)uVar1;
  fStack_7c4 = (float)((ulong)uVar1 >> 0x20);
  fStack_7c0 = (float)uVar2;
  fStack_7bc = (float)((ulong)uVar2 >> 0x20);
  in_RSI[0x3c] = local_7b8 + local_7c8;
  in_RSI[0x3d] = fStack_7b4 + fStack_7c4;
  in_RSI[0x3e] = fStack_7b0 + fStack_7c0;
  in_RSI[0x3f] = fStack_7ac + fStack_7bc;
  local_7d8 = (float)*(undefined8 *)(in_RSI + 0x3c);
  fStack_7d4 = (float)((ulong)*(undefined8 *)(in_RSI + 0x3c) >> 0x20);
  fStack_7d0 = (float)*(undefined8 *)(in_RSI + 0x3e);
  fStack_7cc = (float)((ulong)*(undefined8 *)(in_RSI + 0x3e) >> 0x20);
  in_RSI[0x3c] = local_7d8 + local_f98 * -0.4682;
  in_RSI[0x3d] = fStack_7d4 + fStack_f94 * -0.4682;
  in_RSI[0x3e] = fStack_7d0 + fStack_f90 * -0.4682;
  in_RSI[0x3f] = fStack_7cc + fStack_f8c * -0.4682;
  local_1008 = (float)uVar3;
  fStack_1004 = (float)((ulong)uVar3 >> 0x20);
  fStack_1000 = (float)uVar4;
  fStack_ffc = (float)((ulong)uVar4 >> 0x20);
  in_RDX[0x3c] = local_1008 * 1.8556;
  in_RDX[0x3d] = fStack_1004 * 1.8556;
  in_RDX[0x3e] = fStack_1000 * 1.8556;
  in_RDX[0x3f] = fStack_ffc * 1.8556;
  local_7f8 = (float)*(undefined8 *)(in_RDX + 0x3c);
  fStack_7f4 = (float)((ulong)*(undefined8 *)(in_RDX + 0x3c) >> 0x20);
  fStack_7f0 = (float)*(undefined8 *)(in_RDX + 0x3e);
  fStack_7ec = (float)((ulong)*(undefined8 *)(in_RDX + 0x3e) >> 0x20);
  in_RDX[0x3c] = local_7f8 + local_7c8;
  in_RDX[0x3d] = fStack_7f4 + fStack_7c4;
  in_RDX[0x3e] = fStack_7f0 + fStack_7c0;
  in_RDX[0x3f] = fStack_7ec + fStack_7bc;
  return;
}

Assistant:

static inline void
csc709Inverse64 (float* comp0, float* comp1, float* comp2)
{
    __m128 c0 = {1.5747f, 1.5747f, 1.5747f, 1.5747f};
    __m128 c1 = {1.8556f, 1.8556f, 1.8556f, 1.8556f};
    __m128 c2 = {-0.1873f, -0.1873f, -0.1873f, -0.1873f};
    __m128 c3 = {-0.4682f, -0.4682f, -0.4682f, -0.4682f};

    __m128* r = (__m128*) comp0;
    __m128* g = (__m128*) comp1;
    __m128* b = (__m128*) comp2;
    __m128  src[3];

#    define CSC_INVERSE_709_SSE2_LOOP(i)                                       \
        src[0] = r[i];                                                         \
        src[1] = g[i];                                                         \
        src[2] = b[i];                                                         \
                                                                               \
        r[i] = _mm_add_ps (r[i], _mm_mul_ps (src[2], c0));                     \
                                                                               \
        g[i]   = _mm_mul_ps (g[i], c2);                                        \
        src[2] = _mm_mul_ps (src[2], c3);                                      \
        g[i]   = _mm_add_ps (g[i], src[0]);                                    \
        g[i]   = _mm_add_ps (g[i], src[2]);                                    \
                                                                               \
        b[i] = _mm_mul_ps (c1, src[1]);                                        \
        b[i] = _mm_add_ps (b[i], src[0]);

    CSC_INVERSE_709_SSE2_LOOP (0)
    CSC_INVERSE_709_SSE2_LOOP (1)
    CSC_INVERSE_709_SSE2_LOOP (2)
    CSC_INVERSE_709_SSE2_LOOP (3)

    CSC_INVERSE_709_SSE2_LOOP (4)
    CSC_INVERSE_709_SSE2_LOOP (5)
    CSC_INVERSE_709_SSE2_LOOP (6)
    CSC_INVERSE_709_SSE2_LOOP (7)

    CSC_INVERSE_709_SSE2_LOOP (8)
    CSC_INVERSE_709_SSE2_LOOP (9)
    CSC_INVERSE_709_SSE2_LOOP (10)
    CSC_INVERSE_709_SSE2_LOOP (11)

    CSC_INVERSE_709_SSE2_LOOP (12)
    CSC_INVERSE_709_SSE2_LOOP (13)
    CSC_INVERSE_709_SSE2_LOOP (14)
    CSC_INVERSE_709_SSE2_LOOP (15)
}